

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# length.cpp
# Opt level: O2

void duckdb::ArrayLengthFunction(DataChunk *args,ExpressionState *state,Vector *result)

{
  bool bVar1;
  reference pvVar2;
  reference this;
  idx_t iVar3;
  ulong uVar4;
  idx_t r;
  ulong row_idx;
  UnifiedVectorFormat format;
  
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  UnifiedVectorFormat::UnifiedVectorFormat(&format);
  this = vector<duckdb::Vector,_true>::get<true>(&args->data,0);
  Vector::ToUnifiedFormat(this,args->count,&format);
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  iVar3 = ArrayType::GetSize(&pvVar2->type);
  *(idx_t *)result->data = iVar3;
  if (format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
      (unsigned_long *)0x0) {
    Vector::Flatten(result,args->count);
    FlatVector::VerifyFlatVector(result);
    for (row_idx = 0; row_idx < args->count; row_idx = row_idx + 1) {
      uVar4 = row_idx;
      if ((format.sel)->sel_vector != (sel_t *)0x0) {
        uVar4 = (ulong)(format.sel)->sel_vector[row_idx];
      }
      if ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
           (unsigned_long *)0x0) &&
         ((format.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar4 >> 6] >>
           (uVar4 & 0x3f) & 1) == 0)) {
        TemplatedValidityMask<unsigned_long>::SetInvalid
                  (&(result->validity).super_TemplatedValidityMask<unsigned_long>,row_idx);
      }
    }
    bVar1 = DataChunk::AllConstant(args);
    if (bVar1) {
      Vector::SetVectorType(result,CONSTANT_VECTOR);
    }
  }
  UnifiedVectorFormat::~UnifiedVectorFormat(&format);
  return;
}

Assistant:

static void ArrayLengthFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	auto &input = args.data[0];

	UnifiedVectorFormat format;
	args.data[0].ToUnifiedFormat(args.size(), format);

	// for arrays the length is constant
	result.SetVectorType(VectorType::CONSTANT_VECTOR);
	ConstantVector::GetData<int64_t>(result)[0] = static_cast<int64_t>(ArrayType::GetSize(input.GetType()));

	// but we do need to take null values into account
	if (format.validity.AllValid()) {
		// if there are no null values we can just return the constant
		return;
	}
	// otherwise we flatten and inherit the null values of the parent
	result.Flatten(args.size());
	auto &result_validity = FlatVector::Validity(result);
	for (idx_t r = 0; r < args.size(); r++) {
		auto idx = format.sel->get_index(r);
		if (!format.validity.RowIsValid(idx)) {
			result_validity.SetInvalid(r);
		}
	}
	if (args.AllConstant()) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);
	}
}